

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool __thiscall
httplib::Server::write_response
          (Server *this,Stream *strm,bool last_connection,Request *req,Response *res)

{
  Response *pRVar1;
  Stream *pSVar2;
  bool bVar3;
  int iVar4;
  int *args;
  size_type sVar5;
  Headers *pHVar6;
  pointer ppVar7;
  ulong uVar8;
  size_t sVar9;
  unsigned_long __val;
  size_t offset_00;
  pair<unsigned_long,_unsigned_long> pVar10;
  bool local_2cb;
  bool local_2c9;
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2a8;
  undefined1 local_270 [8];
  string length_1;
  string local_230 [32];
  undefined1 local_210 [8];
  string content_range_1;
  unsigned_long length_2;
  unsigned_long offset_1;
  pair<unsigned_long,_unsigned_long> offsets_1;
  undefined1 local_1b0 [8];
  string content_range;
  unsigned_long offset;
  pair<unsigned_long,_unsigned_long> offsets;
  size_t length;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  _Base_ptr local_148;
  _Base_ptr local_140;
  _Self local_138;
  allocator local_129;
  key_type local_128;
  _Self local_108;
  iterator it;
  string local_f0 [32];
  undefined1 local_d0 [8];
  string boundary;
  string content_type;
  string local_88;
  byte local_61;
  string local_60;
  char *local_40;
  Response *local_38;
  Response *res_local;
  Request *req_local;
  Stream *pSStack_20;
  bool last_connection_local;
  Stream *strm_local;
  Server *this_local;
  
  local_38 = res;
  res_local = (Response *)req;
  req_local._7_1_ = last_connection;
  pSStack_20 = strm;
  strm_local = (Stream *)this;
  if (res->status == -1) {
    __assert_fail("res.status != -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/vladimirlisovskij[P]prog/Labs/Lab6/httplib.h"
                  ,0xb79,
                  "bool httplib::Server::write_response(Stream &, bool, const Request &, Response &)"
                 );
  }
  if ((399 < res->status) &&
     (bVar3 = std::function::operator_cast_to_bool((function *)&this->error_handler_), bVar3)) {
    std::function<void_(const_httplib::Request_&,_httplib::Response_&)>::operator()
              (&this->error_handler_,(Request *)res_local,local_38);
  }
  pSVar2 = pSStack_20;
  args = &local_38->status;
  local_40 = detail::status_message(local_38->status);
  iVar4 = Stream::write_format<int,char_const*>(pSVar2,"HTTP/1.1 %d %s\r\n",args,&local_40);
  if (iVar4 == 0) {
    this_local._7_1_ = 0;
    goto LAB_0014fb68;
  }
  local_61 = 0;
  local_2c9 = true;
  if ((req_local._7_1_ & 1) == 0) {
    Request::get_header_value_abi_cxx11_(&local_60,(Request *)res_local,"Connection",0);
    local_61 = 1;
    local_2c9 = std::operator==(&local_60,"close");
  }
  if ((local_61 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_60);
  }
  if (local_2c9 != false) {
    Response::set_header(local_38,"Connection","close");
  }
  local_2cb = false;
  if ((req_local._7_1_ & 1) == 0) {
    Request::get_header_value_abi_cxx11_(&local_88,(Request *)res_local,"Connection",0);
    local_2cb = std::operator==(&local_88,"Keep-Alive");
    std::__cxx11::string::~string((string *)&local_88);
  }
  if (local_2cb != false) {
    Response::set_header(local_38,"Connection","Keep-Alive");
  }
  bVar3 = Response::has_header(local_38,"Content-Type");
  if (!bVar3) {
    Response::set_header(local_38,"Content-Type","text/plain");
  }
  bVar3 = Response::has_header(local_38,"Accept-Ranges");
  if (!bVar3) {
    Response::set_header(local_38,"Accept-Ranges","bytes");
  }
  std::__cxx11::string::string((string *)(boundary.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_d0);
  sVar5 = std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::size
                    ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
                     ((long)&res_local[1].body.field_2 + 8));
  if (1 < sVar5) {
    detail::make_multipart_data_boundary_abi_cxx11_();
    std::__cxx11::string::operator=((string *)local_d0,local_f0);
    std::__cxx11::string::~string(local_f0);
    pHVar6 = &local_38->headers;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_128,"Content-Type",&local_129);
    local_108._M_node =
         (_Base_ptr)
         std::
         multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find(pHVar6,&local_128);
    std::__cxx11::string::~string((string *)&local_128);
    std::allocator<char>::~allocator((allocator<char> *)&local_129);
    local_138._M_node =
         (_Base_ptr)
         std::
         multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(&local_38->headers);
    bVar3 = std::operator!=(&local_108,&local_138);
    if (bVar3) {
      ppVar7 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator->(&local_108);
      std::__cxx11::string::operator=
                ((string *)(boundary.field_2._M_local_buf + 8),(string *)&ppVar7->second);
      local_140 = local_108._M_node;
      local_148 = (_Base_ptr)
                  std::
                  multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  ::erase_abi_cxx11_((multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                                      *)&local_38->headers,local_108._M_node);
    }
    pHVar6 = &local_38->headers;
    std::operator+(&local_168,"multipart/byteranges; boundary=",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0);
    std::
    multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::emplace<char_const(&)[13],std::__cxx11::string>
              ((multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)pHVar6,(char (*) [13])"Content-Type",&local_168);
    std::__cxx11::string::~string((string *)&local_168);
  }
  uVar8 = std::__cxx11::string::empty();
  if ((uVar8 & 1) == 0) {
    bVar3 = std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::empty
                      ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
                       ((long)&res_local[1].body.field_2 + 8));
    if (!bVar3) {
      sVar5 = std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::size
                        ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
                         ((long)&res_local[1].body.field_2 + 8));
      pRVar1 = res_local;
      if (sVar5 == 1) {
        sVar9 = std::__cxx11::string::size();
        pVar10 = detail::get_range_offset_and_length((Request *)pRVar1,sVar9,0);
        offset_00 = pVar10.second;
        content_range_1.field_2._8_8_ = offset_00;
        offsets_1.first = offset_00;
        sVar9 = std::__cxx11::string::size();
        detail::make_content_range_header_field_abi_cxx11_
                  ((string *)local_210,(detail *)pVar10.first,offset_00,sVar9,(size_t)res);
        Response::set_header(local_38,"Content-Range",(string *)local_210);
        std::__cxx11::string::substr((ulong)local_230,(ulong)&local_38->body);
        std::__cxx11::string::operator=((string *)&local_38->body,local_230);
        std::__cxx11::string::~string(local_230);
        std::__cxx11::string::~string((string *)local_210);
      }
      else {
        detail::make_multipart_ranges_data
                  ((string *)((long)&length_1.field_2 + 8),(Request *)res_local,local_38,
                   (string *)local_d0,(string *)((long)&boundary.field_2 + 8));
        std::__cxx11::string::operator=
                  ((string *)&local_38->body,(string *)(length_1.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(length_1.field_2._M_local_buf + 8));
      }
    }
    __val = std::__cxx11::string::size();
    std::__cxx11::to_string((string *)local_270,__val);
    Response::set_header(local_38,"Content-Length",(string *)local_270);
    std::__cxx11::string::~string((string *)local_270);
  }
  else if (local_38->content_length == 0) {
    bVar3 = std::function::operator_cast_to_bool((function *)&local_38->content_provider);
    if (bVar3) {
      Response::set_header(local_38,"Transfer-Encoding","chunked");
    }
    else {
      Response::set_header(local_38,"Content-Length","0");
    }
  }
  else {
    bVar3 = std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::empty
                      ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
                       ((long)&res_local[1].body.field_2 + 8));
    if (bVar3) {
      offsets.second = local_38->content_length;
    }
    else {
      sVar5 = std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::size
                        ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
                         ((long)&res_local[1].body.field_2 + 8));
      if (sVar5 == 1) {
        pVar10 = detail::get_range_offset_and_length
                           ((Request *)res_local,local_38->content_length,0);
        offsets.second = pVar10.second;
        content_range.field_2._8_8_ = pVar10.first;
        detail::make_content_range_header_field_abi_cxx11_
                  ((string *)local_1b0,(detail *)content_range.field_2._8_8_,offsets.second,
                   local_38->content_length,(size_t)res);
        Response::set_header(local_38,"Content-Range",(string *)local_1b0);
        std::__cxx11::string::~string((string *)local_1b0);
      }
      else {
        offsets.second =
             detail::get_multipart_ranges_data_length
                       ((Request *)res_local,local_38,(string *)local_d0,
                        (string *)((long)&boundary.field_2 + 8));
      }
    }
    pRVar1 = local_38;
    std::__cxx11::to_string((string *)&offsets_1.second,offsets.second);
    Response::set_header(pRVar1,"Content-Length",(string *)&offsets_1.second);
    std::__cxx11::string::~string((string *)&offsets_1.second);
  }
  pSVar2 = pSStack_20;
  pRVar1 = local_38;
  local_2a8._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_2a8._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2a8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2a8._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_2a8._M_t._M_impl._0_8_ = 0;
  local_2a8._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2a8._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::multimap(&local_2a8);
  iVar4 = detail::write_headers<httplib::Response>(pSVar2,pRVar1,&local_2a8);
  std::
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~multimap(&local_2a8);
  if (iVar4 == 0) {
    this_local._7_1_ = 0;
    goto LAB_0014fb34;
  }
  bVar3 = std::operator!=(&res_local->version,"HEAD");
  if (bVar3) {
    uVar8 = std::__cxx11::string::empty();
    if ((uVar8 & 1) == 0) {
      iVar4 = (*pSStack_20->_vptr_Stream[5])(pSStack_20,&local_38->body);
      if (iVar4 != 0) goto LAB_0014faee;
      this_local._7_1_ = 0;
    }
    else {
      bVar3 = std::function::operator_cast_to_bool((function *)&local_38->content_provider);
      if ((!bVar3) ||
         (bVar3 = write_content_with_provider
                            (this,pSStack_20,(Request *)res_local,local_38,(string *)local_d0,
                             (string *)((long)&boundary.field_2 + 8)), bVar3)) goto LAB_0014faee;
      this_local._7_1_ = 0;
    }
  }
  else {
LAB_0014faee:
    bVar3 = std::function::operator_cast_to_bool((function *)&this->logger_);
    if (bVar3) {
      std::function<void_(const_httplib::Request_&,_const_httplib::Response_&)>::operator()
                (&this->logger_,(Request *)res_local,local_38);
    }
    this_local._7_1_ = 1;
  }
LAB_0014fb34:
  std::__cxx11::string::~string((string *)local_d0);
  std::__cxx11::string::~string((string *)(boundary.field_2._M_local_buf + 8));
LAB_0014fb68:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

inline bool Server::write_response(Stream &strm, bool last_connection,
                                   const Request &req, Response &res) {
  assert(res.status != -1);

  if (400 <= res.status && error_handler_) { error_handler_(req, res); }

  // Response line
  if (!strm.write_format("HTTP/1.1 %d %s\r\n", res.status,
                         detail::status_message(res.status))) {
    return false;
  }

  // Headers
  if (last_connection || req.get_header_value("Connection") == "close") {
    res.set_header("Connection", "close");
  }

  if (!last_connection && req.get_header_value("Connection") == "Keep-Alive") {
    res.set_header("Connection", "Keep-Alive");
  }

  if (!res.has_header("Content-Type")) {
    res.set_header("Content-Type", "text/plain");
  }

  if (!res.has_header("Accept-Ranges")) {
    res.set_header("Accept-Ranges", "bytes");
  }

  std::string content_type;
  std::string boundary;

  if (req.ranges.size() > 1) {
    boundary = detail::make_multipart_data_boundary();

    auto it = res.headers.find("Content-Type");
    if (it != res.headers.end()) {
      content_type = it->second;
      res.headers.erase(it);
    }

    res.headers.emplace("Content-Type",
                        "multipart/byteranges; boundary=" + boundary);
  }

  if (res.body.empty()) {
    if (res.content_length > 0) {
      size_t length = 0;
      if (req.ranges.empty()) {
        length = res.content_length;
      } else if (req.ranges.size() == 1) {
        auto offsets =
            detail::get_range_offset_and_length(req, res.content_length, 0);
        auto offset = offsets.first;
        length = offsets.second;
        auto content_range = detail::make_content_range_header_field(
            offset, length, res.content_length);
        res.set_header("Content-Range", content_range);
      } else {
        length = detail::get_multipart_ranges_data_length(req, res, boundary,
                                                          content_type);
      }
      res.set_header("Content-Length", std::to_string(length));
    } else {
      if (res.content_provider) {
        res.set_header("Transfer-Encoding", "chunked");
      } else {
        res.set_header("Content-Length", "0");
      }
    }
  } else {
    if (req.ranges.empty()) {
      ;
    } else if (req.ranges.size() == 1) {
      auto offsets =
          detail::get_range_offset_and_length(req, res.body.size(), 0);
      auto offset = offsets.first;
      auto length = offsets.second;
      auto content_range = detail::make_content_range_header_field(
          offset, length, res.body.size());
      res.set_header("Content-Range", content_range);
      res.body = res.body.substr(offset, length);
    } else {
      res.body =
          detail::make_multipart_ranges_data(req, res, boundary, content_type);
    }

#ifdef CPPHTTPLIB_ZLIB_SUPPORT
    // TODO: 'Accept-Encoding' has gzip, not gzip;q=0
    const auto &encodings = req.get_header_value("Accept-Encoding");
    if (encodings.find("gzip") != std::string::npos &&
        detail::can_compress(res.get_header_value("Content-Type"))) {
      if (detail::compress(res.body)) {
        res.set_header("Content-Encoding", "gzip");
      }
    }
#endif

    auto length = std::to_string(res.body.size());
    res.set_header("Content-Length", length);
  }

  if (!detail::write_headers(strm, res, Headers())) { return false; }

  // Body
  if (req.method != "HEAD") {
    if (!res.body.empty()) {
      if (!strm.write(res.body)) { return false; }
    } else if (res.content_provider) {
      if (!write_content_with_provider(strm, req, res, boundary,
                                       content_type)) {
        return false;
      }
    }
  }

  // Log
  if (logger_) { logger_(req, res); }

  return true;
}